

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clone.cpp
# Opt level: O0

void __thiscall Clone_importSource_Test::TestBody(Clone_importSource_Test *this)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R9;
  AssertHelper local_178 [8];
  Message local_170 [14];
  bool local_162;
  byte local_161;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_2;
  Message local_148 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  string local_120 [32];
  undefined1 local_100 [8];
  AssertionResult gtest_ar_1;
  Message local_e8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0 [32];
  undefined1 local_a0 [8];
  AssertionResult gtest_ar;
  ImportSourcePtr iClone;
  string local_78 [55];
  allocator<char> local_41;
  string local_40 [32];
  undefined1 local_20 [8];
  ImportSourcePtr i;
  Clone_importSource_Test *this_local;
  
  i.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  libcellml::ImportSource::create();
  peVar3 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_40,"import",&local_41);
  libcellml::Entity::setId((string *)peVar3);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  peVar3 = std::
           __shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"this_is_a_url",
             (allocator<char> *)
             ((long)&iClone.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  libcellml::ImportSource::setUrl((string *)peVar3);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&iClone.super___shared_ptr<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_20);
  libcellml::ImportSource::clone();
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_20);
  libcellml::Entity::id_abi_cxx11_();
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::Entity::id_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_a0,(EqHelper<false> *)"i->id()","iClone->id()",
             (char *)local_c0,&local_e0,in_R9);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string(local_c0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x20,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_e8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_20);
  libcellml::ImportSource::url_abi_cxx11_();
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  libcellml::ImportSource::url_abi_cxx11_();
  testing::internal::EqHelper<false>::Compare<std::__cxx11::string,std::__cxx11::string>
            ((AssertionResult *)local_100,(EqHelper<false> *)"i->url()","iClone->url()",
             (char *)local_120,&local_140,in_R9);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string(local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_100);
  if (!bVar1) {
    testing::Message::Message(local_148);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_100);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x21,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_100);
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)local_20);
  local_161 = libcellml::ImportSource::hasModel();
  local_161 = local_161 & 1;
  std::__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::ImportSource,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)&gtest_ar.message_);
  bVar2 = libcellml::ImportSource::hasModel();
  local_162 = (bool)(bVar2 & 1);
  testing::internal::EqHelper<false>::Compare<bool,bool>
            ((AssertionResult *)local_160,(EqHelper<false> *)"i->hasModel()","iClone->hasModel()",
             (char *)&local_161,&local_162,(bool *)in_R9);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
  if (!bVar1) {
    testing::Message::Message(local_170);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
    testing::internal::AssertHelper::AssertHelper
              (local_178,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/clone/clone.cpp"
               ,0x22,pcVar4);
    testing::internal::AssertHelper::operator=(local_178,local_170);
    testing::internal::AssertHelper::~AssertHelper(local_178);
    testing::Message::~Message(local_170);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)&gtest_ar.message_);
  std::shared_ptr<libcellml::ImportSource>::~shared_ptr
            ((shared_ptr<libcellml::ImportSource> *)local_20);
  return;
}

Assistant:

TEST(Clone, importSource)
{
    auto i = libcellml::ImportSource::create();

    i->setId("import");
    i->setUrl("this_is_a_url");

    auto iClone = i->clone();

    EXPECT_EQ(i->id(), iClone->id());
    EXPECT_EQ(i->url(), iClone->url());
    EXPECT_EQ(i->hasModel(), iClone->hasModel());
}